

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx2_harley_seal_improved(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 (*pauVar1) [32];
  size_t i;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 (*pauVar7) [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  uint16_t buffer [16];
  
  if ((char)len != '\0') {
    auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar18 = vpmovsxbd_avx512f(_DAT_0011a080);
    auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar4 = (ulong)(len & 0xffffff00);
    do {
      uVar4 = uVar4 + 1;
      auVar20 = vpbroadcastd_avx512f();
      auVar20 = vpsrlvd_avx512f(auVar20,auVar18);
      auVar20 = vpandd_avx512f(auVar20,auVar19);
      auVar17 = vpaddd_avx512f(auVar20,auVar17);
    } while (uVar4 < len);
    auVar17 = vmovdqu64_avx512f(auVar17);
    *(undefined1 (*) [64])flags = auVar17;
  }
  uVar6 = len >> 4 & 0xfffffff0;
  uVar4 = (ulong)uVar6;
  if (uVar6 == 0) {
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    auVar23 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    auVar24 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  }
  else {
    auVar24._8_2_ = 0x5555;
    auVar24._0_8_ = 0x5555555555555555;
    auVar24._10_2_ = 0x5555;
    auVar24._12_2_ = 0x5555;
    auVar24._14_2_ = 0x5555;
    auVar24._16_2_ = 0x5555;
    auVar24._18_2_ = 0x5555;
    auVar24._20_2_ = 0x5555;
    auVar24._22_2_ = 0x5555;
    auVar24._24_2_ = 0x5555;
    auVar24._26_2_ = 0x5555;
    auVar24._28_2_ = 0x5555;
    auVar24._30_2_ = 0x5555;
    auVar23._8_2_ = 0x3333;
    auVar23._0_8_ = 0x3333333333333333;
    auVar23._10_2_ = 0x3333;
    auVar23._12_2_ = 0x3333;
    auVar23._14_2_ = 0x3333;
    auVar23._16_2_ = 0x3333;
    auVar23._18_2_ = 0x3333;
    auVar23._20_2_ = 0x3333;
    auVar23._22_2_ = 0x3333;
    auVar23._24_2_ = 0x3333;
    auVar23._26_2_ = 0x3333;
    auVar23._28_2_ = 0x3333;
    auVar23._30_2_ = 0x3333;
    auVar21._8_2_ = 0x707;
    auVar21._0_8_ = 0x707070707070707;
    auVar21._10_2_ = 0x707;
    auVar21._12_2_ = 0x707;
    auVar21._14_2_ = 0x707;
    auVar21._16_2_ = 0x707;
    auVar21._18_2_ = 0x707;
    auVar21._20_2_ = 0x707;
    auVar21._22_2_ = 0x707;
    auVar21._24_2_ = 0x707;
    auVar21._26_2_ = 0x707;
    auVar21._28_2_ = 0x707;
    auVar21._30_2_ = 0x707;
    auVar26._8_4_ = 0xf;
    auVar26._0_8_ = 0xf0000000f;
    auVar26._12_4_ = 0xf;
    auVar26._16_4_ = 0xf;
    auVar26._20_4_ = 0xf;
    auVar26._24_4_ = 0xf;
    auVar26._28_4_ = 0xf;
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    auVar22 = ZEXT1664((undefined1  [16])0x0);
    auVar25 = ZEXT1664((undefined1  [16])0x0);
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    uVar2 = 0;
    do {
      auVar11 = auVar25._0_32_;
      auVar10 = auVar22._0_32_;
      auVar8 = auVar27._0_32_;
      auVar9 = auVar28._0_32_;
      uVar5 = uVar2 + 0xffff;
      if (uVar4 - uVar2 < 0x10000) {
        uVar5 = uVar4;
      }
      if (uVar2 < uVar5) {
        pauVar7 = (undefined1 (*) [32])(array + uVar2 * 0x10 + 0xf0);
        do {
          auVar8 = vmovdqu64_avx512vl(pauVar7[-0xc]);
          uVar2 = uVar2 + 0x10;
          auVar9 = vpxorq_avx512vl(pauVar7[-0xf],auVar20._0_32_);
          auVar10 = vpandq_avx512vl(auVar9,pauVar7[-0xe]);
          auVar10 = vpternlogq_avx512vl(auVar10,pauVar7[-0xf],auVar20._0_32_,0xf8);
          auVar11 = vpxorq_avx512vl(auVar9,pauVar7[-0xe]);
          auVar9 = pauVar7[-0xd] ^ auVar11;
          auVar12 = vpandq_avx512vl(auVar9,auVar8);
          auVar11 = vpternlogq_avx512vl(auVar12,auVar11,pauVar7[-0xd],0xf8);
          auVar8 = vpxorq_avx512vl(auVar9,auVar8);
          auVar12 = vpxorq_avx512vl(auVar10,auVar19._0_32_);
          auVar9 = vpand_avx2(auVar11,auVar12);
          auVar9 = vpternlogq_avx512vl(auVar9,auVar10,auVar19._0_32_,0xf8);
          auVar10 = vpxorq_avx512vl(auVar8,pauVar7[-0xb]);
          auVar13 = vpandq_avx512vl(auVar10,pauVar7[-10]);
          auVar8 = vpternlogq_avx512vl(auVar13,auVar8,pauVar7[-0xb],0xf8);
          auVar10 = vpxorq_avx512vl(auVar10,pauVar7[-10]);
          auVar13 = vpxorq_avx512vl(auVar10,pauVar7[-9]);
          auVar14 = vpandq_avx512vl(auVar13,pauVar7[-8]);
          auVar10 = vpternlogq_avx512vl(auVar14,auVar10,pauVar7[-9],0xf8);
          auVar14 = vpxorq_avx512vl(auVar8,auVar11 ^ auVar12);
          auVar13 = vpxorq_avx512vl(auVar13,pauVar7[-8]);
          auVar15 = vpxorq_avx512vl(auVar9,auVar18._0_32_);
          auVar16 = vpandq_avx512vl(auVar10,auVar14);
          auVar8 = vpternlogq_avx512vl(auVar16,auVar8,auVar11 ^ auVar12,0xf8);
          auVar10 = vpxorq_avx512vl(auVar10,auVar14);
          auVar11 = vpandq_avx512vl(auVar8,auVar15);
          auVar14 = vpternlogq_avx512vl(auVar11,auVar9,auVar18._0_32_,0xf8);
          auVar11 = vpxorq_avx512vl(auVar8,auVar15);
          auVar9 = vpxorq_avx512vl(auVar13,pauVar7[-7]);
          auVar8 = vpandq_avx512vl(auVar9,pauVar7[-6]);
          auVar8 = vpternlogq_avx512vl(auVar8,auVar13,pauVar7[-7],0xf8);
          auVar9 = vpxorq_avx512vl(auVar9,pauVar7[-6]);
          auVar12 = vpxorq_avx512vl(auVar9,pauVar7[-5]);
          auVar13 = vpandq_avx512vl(auVar12,pauVar7[-4]);
          auVar9 = vpternlogq_avx512vl(auVar13,auVar9,pauVar7[-5],0xf8);
          auVar13 = vpxorq_avx512vl(auVar8,auVar10);
          auVar12 = vpxorq_avx512vl(auVar12,pauVar7[-4]);
          auVar15 = vmovdqu64_avx512vl(pauVar7[-2]);
          auVar16 = vpandq_avx512vl(auVar9,auVar13);
          auVar16 = vpternlogq_avx512vl(auVar16,auVar8,auVar10,0xf8);
          auVar9 = vpxorq_avx512vl(auVar9,auVar13);
          auVar8 = vpxorq_avx512vl(auVar12,pauVar7[-3]);
          auVar10 = vpandq_avx512vl(auVar8,auVar15);
          auVar10 = vpternlogq_avx512vl(auVar10,auVar12,pauVar7[-3],0xf8);
          pauVar1 = pauVar7 + -1;
          auVar8 = vpxorq_avx512vl(auVar8,auVar15);
          auVar12 = vmovdqu64_avx512vl(*pauVar7);
          pauVar7 = pauVar7 + 0x10;
          auVar13 = vpxorq_avx512vl(auVar8,*pauVar1);
          auVar15 = vpandq_avx512vl(auVar13,auVar12);
          auVar8 = vpternlogq_avx512vl(auVar15,auVar8,*pauVar1,0xf8);
          auVar15 = vpxorq_avx512vl(auVar10,auVar9);
          auVar12 = vpxorq_avx512vl(auVar13,auVar12);
          auVar20 = ZEXT3264(auVar12);
          auVar12 = vpandq_avx512vl(auVar8,auVar15);
          auVar13 = vpternlogq_avx512vl(auVar12,auVar10,auVar9,0xf8);
          auVar9 = vpxorq_avx512vl(auVar8,auVar15);
          auVar19 = ZEXT3264(auVar9);
          auVar9 = vpandq_avx512vl(auVar13,auVar16 ^ auVar11);
          auVar15 = vpternlogq_avx512vl(auVar9,auVar16,auVar11,0xf8);
          auVar8 = vpsrld_avx2(auVar29._0_32_,1);
          auVar9 = vpand_avx2(auVar29._0_32_,auVar24);
          auVar12 = auVar14 ^ auVar17._0_32_;
          auVar8 = vpand_avx2(auVar8,auVar24);
          auVar9 = vphaddw_avx2(auVar9,auVar8);
          auVar8 = vpsrld_avx2(auVar9,2);
          auVar9 = vpand_avx2(auVar9,auVar23);
          auVar8 = vpand_avx2(auVar8,auVar23);
          auVar9 = vphaddw_avx2(auVar9,auVar8);
          auVar8 = vpsrld_avx2(auVar9,4);
          auVar9 = vpand_avx2(auVar21,auVar9);
          auVar8 = vpand_avx2(auVar8,auVar21);
          auVar10 = vphaddw_avx2(auVar9,auVar8);
          auVar9 = vpxorq_avx512vl(auVar13,auVar16 ^ auVar11);
          auVar18 = ZEXT3264(auVar9);
          auVar9 = vpand_avx2(auVar10,auVar26);
          auVar9 = vpaddd_avx2(auVar9,auVar28._0_32_);
          auVar28 = ZEXT3264(auVar9);
          auVar8 = vpsrld_avx2(auVar10,8);
          auVar8 = vpand_avx2(auVar8,auVar26);
          auVar8 = vpaddd_avx2(auVar27._0_32_,auVar8);
          auVar27 = ZEXT3264(auVar8);
          auVar11 = vpsrld_avx2(auVar10,0x10);
          auVar10 = vpsrld_avx2(auVar10,0x18);
          auVar11 = vpand_avx2(auVar11,auVar26);
          auVar10 = vpaddd_avx2(auVar10,auVar22._0_32_);
          auVar22 = ZEXT3264(auVar10);
          auVar13 = vpandq_avx512vl(auVar15,auVar12);
          auVar13 = vpternlogq_avx512vl(auVar13,auVar14,auVar17._0_32_,0xf8);
          auVar29 = ZEXT3264(auVar13);
          auVar11 = vpaddd_avx2(auVar11,auVar25._0_32_);
          auVar25 = ZEXT3264(auVar11);
          auVar12 = vpxorq_avx512vl(auVar15,auVar12);
          auVar17 = ZEXT3264(auVar12);
        } while (uVar2 < uVar5);
      }
      auVar13 = vpsrld_avx2(auVar29._0_32_,1);
      auVar12 = vpand_avx2(auVar29._0_32_,auVar24);
      auVar13 = vpand_avx2(auVar13,auVar24);
      auVar12 = vphaddw_avx2(auVar12,auVar13);
      auVar13 = vpsrld_avx2(auVar12,2);
      auVar12 = vpand_avx2(auVar12,auVar23);
      auVar13 = vpand_avx2(auVar13,auVar23);
      auVar12 = vphaddw_avx2(auVar12,auVar13);
      auVar13 = vpsrld_avx2(auVar12,4);
      auVar12 = vpand_avx2(auVar12,auVar21);
      auVar13 = vpand_avx2(auVar13,auVar21);
      auVar13 = vphaddw_avx2(auVar12,auVar13);
      auVar12 = vpand_avx2(auVar13,auVar26);
      auVar9 = vpaddd_avx2(auVar12,auVar9);
      auVar28 = ZEXT3264(auVar9);
      auVar12 = vpsrld_avx2(auVar13,8);
      auVar12 = vpand_avx2(auVar12,auVar26);
      auVar8 = vpaddd_avx2(auVar8,auVar12);
      auVar27 = ZEXT3264(auVar8);
      auVar12 = vpsrld_avx2(auVar13,0x10);
      auVar13 = vpsrld_avx2(auVar13,0x18);
      auVar12 = vpand_avx2(auVar12,auVar26);
      auVar10 = vpaddd_avx2(auVar13,auVar10);
      auVar22 = ZEXT3264(auVar10);
      auVar11 = vpaddd_avx2(auVar12,auVar11);
      auVar25 = ZEXT3264(auVar11);
    } while (uVar2 < uVar4);
    auVar24 = vpslld_avx2(auVar9,4);
    auVar23 = vpslld_avx2(auVar8,4);
    auVar18 = ZEXT3264(auVar23);
    auVar23 = vpslld_avx2(auVar11,4);
    auVar21 = vpslld_avx2(auVar10,4);
    auVar17 = ZEXT3264(auVar21);
  }
  auVar19 = vpmovsxbd_avx512f(_DAT_0011a0f0);
  auVar23 = vpermq_avx2(auVar23,0xd8);
  auVar20 = vpmovsxbd_avx512f(_DAT_0011a100);
  auVar22 = vpmovsxbd_avx512f(_DAT_0011a110);
  auVar25 = vpmovsxbd_avx512f(_DAT_0011a120);
  lVar3 = 0;
  auVar21 = vpermi2ps_avx512vl(_DAT_0011d0e0,auVar24,auVar23);
  auVar27 = vinsertf64x4_avx512f(ZEXT3264(auVar21),auVar18._0_32_,1);
  auVar19 = vpermi2d_avx512f(auVar19,auVar27,auVar17);
  auVar27 = vpmovsxbd_avx512f(_DAT_0011a130);
  auVar19 = vpermi2d_avx512f(auVar27,auVar19,auVar18);
  auVar19 = vpermi2d_avx512f(auVar20,auVar19,auVar17);
  auVar20 = vpmovsxbq_avx512f(ZEXT816(0x9050403020100));
  auVar19 = vpermi2q_avx512f(auVar20,auVar19,auVar18);
  auVar20 = vpmovsxbd_avx512f(_DAT_0011a140);
  auVar19 = vpermi2d_avx512f(auVar22,auVar19,auVar17);
  auVar22 = vpmovsxbd_avx512f(_DAT_0011a150);
  auVar19 = vpermi2d_avx512f(auVar22,auVar19,auVar18);
  auVar22 = vpmovsxbd_avx512f(_DAT_0011a160);
  auVar19 = vpermi2d_avx512f(auVar25,auVar19,auVar17);
  auVar24 = vpermi2ps_avx512vl(_DAT_0011d100,auVar24,auVar23);
  auVar25 = vpmovsxbd_avx512f(_DAT_0011a170);
  auVar27 = vinsertf32x4_avx512f(ZEXT3264(auVar24),auVar18._16_16_,2);
  auVar28 = vpmovsxbd_avx512f(_DAT_0011a180);
  auVar20 = vpermi2d_avx512f(auVar20,auVar27,auVar17);
  auVar20 = vpermi2d_avx512f(auVar22,auVar20,auVar18);
  auVar22 = vpmovsxbq_avx512f(ZEXT816(0xb050403020100));
  auVar20 = vpermi2d_avx512f(auVar28,auVar20,auVar17);
  auVar27 = vpmovsxbd_avx512f(_DAT_0011a190);
  auVar20 = vpermi2q_avx512f(auVar22,auVar20,auVar18);
  auVar22 = vpmovsxbd_avx512f(_DAT_0011a1a0);
  auVar20 = vpermi2d_avx512f(auVar27,auVar20,auVar17);
  auVar18 = vpermi2d_avx512f(auVar22,auVar20,auVar18);
  auVar20 = vpbroadcastd_avx512f(ZEXT416(1));
  auVar17 = vpermi2d_avx512f(auVar25,auVar18,auVar17);
  auVar17 = vpaddd_avx512f(auVar19,auVar17);
  auVar17 = vpaddd_avx512f(auVar17,*(undefined1 (*) [64])flags);
  auVar17 = vmovdqu64_avx512f(auVar17);
  *(undefined1 (*) [64])flags = auVar17;
  auVar17 = vpmovsxbd_avx512f(_DAT_0011a080);
  auVar18 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar3 = lVar3 + 1;
    auVar19 = vpbroadcastd_avx512f();
    auVar19 = vpsrlvd_avx512f(auVar19,auVar17);
    auVar19 = vpandd_avx512f(auVar19,auVar20);
    auVar18 = vpaddd_avx512f(auVar19,auVar18);
  } while (lVar3 != 0x10);
  auVar18 = vmovdqu64_avx512f(auVar18);
  *(undefined1 (*) [64])flags = auVar18;
  auVar18 = vpbroadcastd_avx512f(ZEXT416(2));
  lVar3 = 0;
  auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar3 = lVar3 + 1;
    auVar20 = vpbroadcastd_avx512f();
    auVar20 = vpsrlvd_avx512f(auVar20,auVar17);
    auVar20 = vpaddd_avx512f(auVar20,auVar20);
    auVar20 = vpandd_avx512f(auVar20,auVar18);
    auVar19 = vpaddd_avx512f(auVar20,auVar19);
  } while (lVar3 != 0x10);
  auVar18 = vmovdqu64_avx512f(auVar19);
  *(undefined1 (*) [64])flags = auVar18;
  auVar18 = vpbroadcastd_avx512f(ZEXT416(4));
  lVar3 = 0;
  auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar3 = lVar3 + 1;
    auVar20 = vpbroadcastd_avx512f();
    auVar20 = vpsrlvd_avx512f(auVar20,auVar17);
    auVar20 = vpslld_avx512f(auVar20,2);
    auVar20 = vpandd_avx512f(auVar20,auVar18);
    auVar19 = vpaddd_avx512f(auVar20,auVar19);
  } while (lVar3 != 0x10);
  auVar18 = vmovdqu64_avx512f(auVar19);
  *(undefined1 (*) [64])flags = auVar18;
  auVar18 = vpbroadcastd_avx512f(ZEXT416(8));
  lVar3 = 0;
  auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar3 = lVar3 + 1;
    auVar20 = vpbroadcastd_avx512f();
    auVar20 = vpsrlvd_avx512f(auVar20,auVar17);
    auVar20 = vpslld_avx512f(auVar20,3);
    auVar20 = vpandd_avx512f(auVar20,auVar18);
    auVar19 = vpaddd_avx512f(auVar20,auVar19);
  } while (lVar3 != 0x10);
  auVar17 = vmovdqu64_avx512f(auVar19);
  *(undefined1 (*) [64])flags = auVar17;
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_harley_seal_improved(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (16 * 16)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m256i* data = (const __m256i*)array;
    size_t size = len / 16;
    __m256i v1  = _mm256_setzero_si256();
    __m256i v2  = _mm256_setzero_si256();
    __m256i v4  = _mm256_setzero_si256();
    __m256i v8  = _mm256_setzero_si256();
    __m256i v16 = _mm256_setzero_si256();
    __m256i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;
    uint16_t buffer[16];
    __m256i counter[4];
    for (size_t i = 0; i < 4; ++i) {
        counter[i] = _mm256_setzero_si256();
    }

    while (i < limit) {

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define horizreduce(input, mask, shift, output) \
        __m256i output; \
        { \
            const __m256i tmp0 = _mm256_and_si256(input, mask); \
            const __m256i tmp1 = _mm256_and_si256(_mm256_srli_epi32(input, shift), mask); \
            output = _mm256_hadd_epi16(tmp0, tmp1); \
        }

            pospopcnt_csa_avx2(&twosA,  &v1, _mm256_loadu_si256(data + i +  0), _mm256_loadu_si256(data + i +  1));
            pospopcnt_csa_avx2(&twosB,  &v1, _mm256_loadu_si256(data + i +  2), _mm256_loadu_si256(data + i +  3));
            pospopcnt_csa_avx2(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_avx2(&twosA,  &v1, _mm256_loadu_si256(data + i +  4), _mm256_loadu_si256(data + i +  5));
            pospopcnt_csa_avx2(&twosB,  &v1, _mm256_loadu_si256(data + i +  6), _mm256_loadu_si256(data + i +  7));
            pospopcnt_csa_avx2(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_avx2(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_avx2(&twosA,  &v1, _mm256_loadu_si256(data + i +  8),  _mm256_loadu_si256(data + i +  9));
            pospopcnt_csa_avx2(&twosB,  &v1, _mm256_loadu_si256(data + i + 10),  _mm256_loadu_si256(data + i + 11));
            pospopcnt_csa_avx2(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_avx2(&twosA,  &v1, _mm256_loadu_si256(data + i + 12),  _mm256_loadu_si256(data + i + 13));
            pospopcnt_csa_avx2(&twosB,  &v1, _mm256_loadu_si256(data + i + 14),  _mm256_loadu_si256(data + i + 15));
            pospopcnt_csa_avx2(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_avx2(&eightsB,&v4, foursA, foursB);
            {
                horizreduce(v16, _mm256_set1_epi8(0x55), 1, t0); // t0 = 2-bit counters
                horizreduce(t0,  _mm256_set1_epi8(0x33), 2, t1); // t1 = 4-bit counters
                horizreduce(t1,  _mm256_set1_epi8(0x0f), 4, t2); // t2 = 8-bit counters

                const __m256i mask_byte0 = _mm256_set1_epi32(0x000000ff);
                counter[0] = _mm256_add_epi32(counter[0], t2 & mask_byte0);
                counter[1] = _mm256_add_epi32(counter[1], _mm256_srli_epi32(t2, 1*8) & mask_byte0);
                counter[2] = _mm256_add_epi32(counter[2], _mm256_srli_epi32(t2, 2*8) & mask_byte0);
                counter[3] = _mm256_add_epi32(counter[3], _mm256_srli_epi32(t2, 3*8) & mask_byte0);
            }
            pospopcnt_csa_avx2(&v16, &v8, eightsA, eightsB);
        } // for

        // update the counters after the last iteration
        {
            horizreduce(v16, _mm256_set1_epi8(0x55), 1, t0);
            horizreduce(t0,  _mm256_set1_epi8(0x33), 2, t1);
            horizreduce(t1,  _mm256_set1_epi8(0x0f), 4, t2);

            const __m256i mask_byte0 = _mm256_set1_epi32(0x000000ff);
            counter[0] = _mm256_add_epi32(counter[0], t2 & mask_byte0);
            counter[1] = _mm256_add_epi32(counter[1], _mm256_srli_epi32(t2, 1*8) & mask_byte0);
            counter[2] = _mm256_add_epi32(counter[2], _mm256_srli_epi32(t2, 2*8) & mask_byte0);
            counter[3] = _mm256_add_epi32(counter[3], _mm256_srli_epi32(t2, 3*8) & mask_byte0);
        }
#undef horizreduce
    }

    counter[0] = _mm256_slli_epi32(counter[0], 4); // * 16
    counter[1] = _mm256_slli_epi32(counter[1], 4); // * 16
    counter[2] = _mm256_slli_epi32(counter[2], 4); // * 16
    counter[3] = _mm256_slli_epi32(counter[3], 4); // * 16

    flags[0] += _mm256_extract_epi32(counter[0], 0) + _mm256_extract_epi32(counter[0], 4);
    flags[1] += _mm256_extract_epi32(counter[2], 0) + _mm256_extract_epi32(counter[2], 4);
    flags[2] += _mm256_extract_epi32(counter[0], 1) + _mm256_extract_epi32(counter[0], 5);
    flags[3] += _mm256_extract_epi32(counter[2], 1) + _mm256_extract_epi32(counter[2], 5);
    flags[4] += _mm256_extract_epi32(counter[0], 2) + _mm256_extract_epi32(counter[0], 6);
    flags[5] += _mm256_extract_epi32(counter[2], 2) + _mm256_extract_epi32(counter[2], 6);
    flags[6] += _mm256_extract_epi32(counter[0], 3) + _mm256_extract_epi32(counter[0], 7);
    flags[7] += _mm256_extract_epi32(counter[2], 3) + _mm256_extract_epi32(counter[2], 7);

    flags[8]  += _mm256_extract_epi32(counter[1], 0) + _mm256_extract_epi32(counter[1], 4);
    flags[9]  += _mm256_extract_epi32(counter[3], 0) + _mm256_extract_epi32(counter[3], 4);
    flags[10] += _mm256_extract_epi32(counter[1], 1) + _mm256_extract_epi32(counter[1], 5);
    flags[11] += _mm256_extract_epi32(counter[3], 1) + _mm256_extract_epi32(counter[3], 5);
    flags[12] += _mm256_extract_epi32(counter[1], 2) + _mm256_extract_epi32(counter[1], 6);
    flags[13] += _mm256_extract_epi32(counter[3], 2) + _mm256_extract_epi32(counter[3], 6);
    flags[14] += _mm256_extract_epi32(counter[1], 3) + _mm256_extract_epi32(counter[1], 7);
    flags[15] += _mm256_extract_epi32(counter[3], 3) + _mm256_extract_epi32(counter[3], 7);

    _mm256_storeu_si256((__m256i*)buffer, v1);
    for (size_t i = 0; i < 16; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm256_storeu_si256((__m256i*)buffer, v2);
    for (size_t i = 0; i < 16; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm256_storeu_si256((__m256i*)buffer, v4);
    for (size_t i = 0; i < 16; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm256_storeu_si256((__m256i*)buffer, v8);
    for (size_t i = 0; i < 16; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}